

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::add_ses_extension
          (session_impl *this,shared_ptr<libtorrent::plugin> *ext)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  reference pvVar4;
  enable_shared_from_this<libtorrent::aux::session_impl> local_78;
  weak_ptr<libtorrent::aux::session_impl> local_68;
  undefined1 local_58 [8];
  session_handle h;
  shared_ptr<libtorrent::plugin> local_38;
  uchar local_28;
  uchar local_27;
  bitfield_flag local_26;
  uchar local_25;
  uchar local_24;
  bitfield_flag local_23;
  uchar local_22;
  uchar local_21;
  bitfield_flag local_20;
  uchar local_1f;
  uchar local_1e;
  bitfield_flag local_1d;
  uchar local_1c;
  uchar local_1b;
  bitfield_flag local_1a;
  bitfield_flag<unsigned_char,_libtorrent::feature_flags_tag,_void> local_19;
  shared_ptr<libtorrent::plugin> *psStack_18;
  feature_flags_t features;
  shared_ptr<libtorrent::plugin> *ext_local;
  session_impl *this_local;
  
  psStack_18 = ext;
  peVar3 = ::std::__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ext);
  iVar2 = (*peVar3->_vptr_plugin[2])();
  local_19.m_val = (uchar)iVar2;
  pvVar4 = ::std::
           array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
           ::operator[](&this->m_ses_extensions,0);
  ::std::
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ::push_back(pvVar4,ext);
  local_1b = local_19.m_val;
  local_1c = '\x02';
  local_1a = (bitfield_flag)
             libtorrent::flags::operator&
                       (local_19,(bitfield_flag<unsigned_char,_libtorrent::feature_flags_tag,_void>)
                                 '\x02');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1a);
  if (bVar1) {
    pvVar4 = ::std::
             array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
             ::operator[](&this->m_ses_extensions,1);
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::push_back(pvVar4,ext);
  }
  local_1e = local_19.m_val;
  local_1f = '\x04';
  local_1d = (bitfield_flag)
             libtorrent::flags::operator&
                       (local_19,(bitfield_flag<unsigned_char,_libtorrent::feature_flags_tag,_void>)
                                 '\x04');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1d);
  if (bVar1) {
    pvVar4 = ::std::
             array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
             ::operator[](&this->m_ses_extensions,2);
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::push_back(pvVar4,ext);
  }
  local_21 = local_19.m_val;
  local_22 = '\b';
  local_20 = (bitfield_flag)
             libtorrent::flags::operator&
                       (local_19,(bitfield_flag<unsigned_char,_libtorrent::feature_flags_tag,_void>)
                                 '\b');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_20);
  if (bVar1) {
    pvVar4 = ::std::
             array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
             ::operator[](&this->m_ses_extensions,3);
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::push_back(pvVar4,ext);
  }
  local_24 = local_19.m_val;
  local_25 = ' ';
  local_23 = (bitfield_flag)
             libtorrent::flags::operator&
                       (local_19,(bitfield_flag<unsigned_char,_libtorrent::feature_flags_tag,_void>)
                                 ' ');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_23);
  if (bVar1) {
    pvVar4 = ::std::
             array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
             ::operator[](&this->m_ses_extensions,4);
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::push_back(pvVar4,ext);
  }
  local_27 = local_19.m_val;
  local_28 = '\x10';
  local_26 = (bitfield_flag)
             libtorrent::flags::operator&
                       (local_19,(bitfield_flag<unsigned_char,_libtorrent::feature_flags_tag,_void>)
                                 '\x10');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_26);
  if (bVar1) {
    ::std::shared_ptr<libtorrent::plugin>::shared_ptr(&local_38,ext);
    alert_manager::add_extension(&this->m_alerts,&local_38);
    ::std::shared_ptr<libtorrent::plugin>::~shared_ptr(&local_38);
  }
  ::std::enable_shared_from_this<libtorrent::aux::session_impl>::shared_from_this(&local_78);
  ::std::weak_ptr<libtorrent::aux::session_impl>::weak_ptr<libtorrent::aux::session_impl,void>
            (&local_68,(shared_ptr<libtorrent::aux::session_impl> *)&local_78);
  session_handle::session_handle((session_handle *)local_58,&local_68);
  ::std::weak_ptr<libtorrent::aux::session_impl>::~weak_ptr(&local_68);
  ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)&local_78);
  peVar3 = ::std::__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ext);
  (*peVar3->_vptr_plugin[4])(peVar3,local_58);
  session_handle::~session_handle((session_handle *)local_58);
  return;
}

Assistant:

void session_impl::add_ses_extension(std::shared_ptr<plugin> ext)
	{
		// this is called during startup of the session, from the thread creating
		// it, not its own thread
//		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT_VAL(ext, ext);

		feature_flags_t const features = ext->implemented_features();

		m_ses_extensions[plugins_all_idx].push_back(ext);

		if (features & plugin::optimistic_unchoke_feature)
			m_ses_extensions[plugins_optimistic_unchoke_idx].push_back(ext);
		if (features & plugin::tick_feature)
			m_ses_extensions[plugins_tick_idx].push_back(ext);
		if (features & plugin::dht_request_feature)
			m_ses_extensions[plugins_dht_request_idx].push_back(ext);
		if (features & plugin::unknown_torrent_feature)
			m_ses_extensions[plugins_unknown_torrent_idx].push_back(ext);
		if (features & plugin::alert_feature)
			m_alerts.add_extension(ext);
		session_handle h(shared_from_this());
		ext->added(h);
	}